

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repository.cpp
# Opt level: O3

void so_5::stats::repository_t::source_list_remove(source_t *what,source_t **head,source_t **tail)

{
  source_t *psVar1;
  source_t **ppsVar2;
  
  psVar1 = what->m_next;
  ppsVar2 = &what->m_prev->m_next;
  if (what->m_prev == (source_t *)0x0) {
    ppsVar2 = head;
  }
  *ppsVar2 = psVar1;
  ppsVar2 = &psVar1->m_prev;
  if (psVar1 == (source_t *)0x0) {
    ppsVar2 = tail;
  }
  *ppsVar2 = what->m_prev;
  return;
}

Assistant:

void
repository_t::source_list_remove(
	source_t & what,
	source_t *& head,
	source_t *& tail )
	{
		if( what.m_prev )
			what.m_prev->m_next = what.m_next;
		else
			head = what.m_next;

		if( what.m_next )
			what.m_next->m_prev = what.m_prev;
		else
			tail = what.m_prev;
	}